

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

void Image_Function_Helper::Resize(ResizeForm4 resize,Image *in,Image *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ImageTemplate<unsigned_char> *in_RDX;
  ImageTemplate<unsigned_char> *in_RSI;
  code *in_RDI;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  (*in_RDI)(in_RSI,0,0,uVar1,uVar2,in_RDX,0,0,uVar3,uVar4);
  return;
}

Assistant:

void Resize( FunctionTable::ResizeForm4 resize,
                 const Image & in, Image & out )
    {
        Image_Function::ParameterValidation( in );
        Image_Function::ParameterValidation( out );

        resize( in, 0, 0, in.width(), in.height(), out, 0, 0, out.width(), out.height() );
    }